

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

void __thiscall
unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
decrement_inode_count<unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *this)

{
  if (*(long *)(this + 0x18) != 0) {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
    db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::decrease_memory_use
              ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,0x30);
    return;
  }
  __assert_fail("node_counts[as_i<INode::type>] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                ,0x5e0,
                "void unodb::db<unsigned long, std::span<const std::byte>>::decrement_inode_count() [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::inode_4<unsigned long, std::span<const std::byte>>]"
               );
}

Assistant:

constexpr void db<Key, Value>::decrement_inode_count() noexcept {
  static_assert(inode_defs_type::template is_inode<INode>());
  UNODB_DETAIL_ASSERT(node_counts[as_i<INode::type>] > 0);

  --node_counts[as_i<INode::type>];
  decrease_memory_use(sizeof(INode));
}